

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  lu_byte *plVar1;
  FuncState *pFVar2;
  lua_State *L_00;
  Proto *pPVar3;
  byte bVar4;
  int iVar5;
  Proto **ppPVar6;
  TString *pTVar7;
  long lVar8;
  int iVar9;
  lua_State *L;
  FuncState *fs;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_98;
  FuncState local_80;
  
  pFVar2 = ls->fs;
  L_00 = ls->L;
  pPVar3 = pFVar2->f;
  iVar5 = pPVar3->sizep;
  lVar8 = (long)iVar5;
  if (iVar5 <= pFVar2->np) {
    ppPVar6 = (Proto **)
              luaM_growaux_(L_00,pPVar3->p,pFVar2->np,&pPVar3->sizep,8,0x1ffff,"functions");
    pPVar3->p = ppPVar6;
    iVar9 = pPVar3->sizep;
    if (iVar5 < iVar9) {
      do {
        pPVar3->p[lVar8] = (Proto *)0x0;
        lVar8 = lVar8 + 1;
      } while (iVar9 != lVar8);
    }
  }
  local_80.f = luaF_newproto(L_00);
  ppPVar6 = pPVar3->p;
  iVar5 = pFVar2->np;
  pFVar2->np = iVar5 + 1;
  ppPVar6[iVar5] = local_80.f;
  if (((pPVar3->marked & 0x20) != 0) && (((local_80.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L_00,(GCObject *)pPVar3,(GCObject *)local_80.f);
  }
  (local_80.f)->linedefined = line;
  open_func(ls,&local_80,&local_98);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar7 = luaX_newstring(ls,"self",4);
    new_localvarkind(ls,pTVar7,'\0');
    adjustlocalvars(ls,1);
  }
  pFVar2 = ls->fs;
  pPVar3 = pFVar2->f;
  iVar5 = (ls->t).token;
  iVar9 = 0;
  if (iVar5 == 0x29) {
LAB_00115e47:
    adjustlocalvars(ls,iVar9);
    bVar4 = pFVar2->nactvar;
    pPVar3->numparams = bVar4;
  }
  else {
    iVar9 = 0;
    while (iVar5 == 0x123) {
      pTVar7 = str_checkname(ls);
      new_localvarkind(ls,pTVar7,'\0');
      if ((ls->t).token != 0x2c) {
        iVar9 = iVar9 + 1;
        goto LAB_00115e47;
      }
      luaX_next(ls);
      iVar9 = iVar9 + 1;
      iVar5 = (ls->t).token;
    }
    if (iVar5 != 0x118) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    adjustlocalvars(ls,iVar9);
    bVar4 = pFVar2->nactvar;
    pPVar3->numparams = bVar4;
    plVar1 = &pFVar2->f->flag;
    *plVar1 = *plVar1 | 1;
    luaK_codeABCk(pFVar2,OP_VARARGPREP,(uint)bVar4,0,0,0);
    bVar4 = pFVar2->nactvar;
  }
  luaK_reserveregs(pFVar2,(uint)bVar4);
  checknext(ls,0x29);
  statlist(ls);
  (local_80.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  pFVar2 = ls->fs->prev;
  iVar5 = luaK_codeABx(pFVar2,OP_CLOSURE,0,pFVar2->np + -1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOC;
  (e->u).info = iVar5;
  luaK_exp2nextreg(pFVar2,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}